

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Node * __thiscall wasm::DataFlow::Graph::doVisitBinary(Graph *this,Binary *curr)

{
  BinaryOp BVar1;
  bool bVar2;
  Graph *this_00;
  Binary *curr_00;
  Node *pNVar3;
  Node *ret_1;
  BinaryOp opposite;
  Builder builder;
  Node *ret;
  Node *right;
  Node *left;
  Binary *curr_local;
  Graph *this_local;
  
  BVar1 = curr->op;
  if (BVar1 < GtSInt32) {
LAB_01bbbf5b:
    pNVar3 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                       ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->left);
    this_00 = (Graph *)expandFromI1(this,pNVar3,(Expression *)curr);
    bVar2 = Node::isBad((Node *)this_00);
    this_local = this_00;
    if (!bVar2) {
      pNVar3 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                         ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->right
                         );
      this_local = (Graph *)expandFromI1(this,pNVar3,(Expression *)curr);
      bVar2 = Node::isBad((Node *)this_local);
      if (!bVar2) {
        pNVar3 = Node::makeExpr((Expression *)curr,(Expression *)curr);
        builder.wasm = (Module *)addNode(this,pNVar3);
        Node::addValue((Node *)builder.wasm,(Node *)this_00);
        Node::addValue((Node *)builder.wasm,(Node *)this_local);
        this_local = (Graph *)builder.wasm;
      }
    }
  }
  else {
    if (3 < BVar1 - GtSInt32) {
      if (BVar1 - AddInt64 < 0x15) goto LAB_01bbbf5b;
      if (3 < BVar1 - GtSInt64) {
        pNVar3 = makeVar(this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)16>).
                                    super_Expression.type.id);
        return pNVar3;
      }
    }
    Builder::Builder((Builder *)&stack0xffffffffffffffc0,this->module);
    switch(curr->op) {
    case GtSInt32:
      ret_1._4_4_ = LtSInt32;
      break;
    case GtUInt32:
      ret_1._4_4_ = LtUInt32;
      break;
    case GeSInt32:
      ret_1._4_4_ = LeSInt32;
      break;
    case GeUInt32:
      ret_1._4_4_ = LeUInt32;
      break;
    default:
      handle_unreachable("unexpected op",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/graph.h"
                         ,0x22b);
    case GtSInt64:
      ret_1._4_4_ = LtSInt64;
      break;
    case GtUInt64:
      ret_1._4_4_ = LtUInt64;
      break;
    case GeSInt64:
      ret_1._4_4_ = LeSInt64;
      break;
    case GeUInt64:
      ret_1._4_4_ = LeUInt64;
    }
    curr_00 = Builder::makeBinary((Builder *)&stack0xffffffffffffffc0,ret_1._4_4_,curr->right,
                                  curr->left);
    this_local = (Graph *)UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::
                          visitBinary((UnifiedExpressionVisitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>
                                       *)this,curr_00);
    (this_local->bad).origin = (Expression *)curr;
  }
  return &this_local->bad;
}

Assistant:

Node* doVisitBinary(Binary* curr) {
    // First, check if we support this op.
    switch (curr->op) {
      case AddInt32:
      case AddInt64:
      case SubInt32:
      case SubInt64:
      case MulInt32:
      case MulInt64:
      case DivSInt32:
      case DivSInt64:
      case DivUInt32:
      case DivUInt64:
      case RemSInt32:
      case RemSInt64:
      case RemUInt32:
      case RemUInt64:
      case AndInt32:
      case AndInt64:
      case OrInt32:
      case OrInt64:
      case XorInt32:
      case XorInt64:
      case ShlInt32:
      case ShlInt64:
      case ShrUInt32:
      case ShrUInt64:
      case ShrSInt32:
      case ShrSInt64:
      case RotLInt32:
      case RotLInt64:
      case RotRInt32:
      case RotRInt64:
      case EqInt32:
      case EqInt64:
      case NeInt32:
      case NeInt64:
      case LtSInt32:
      case LtSInt64:
      case LtUInt32:
      case LtUInt64:
      case LeSInt32:
      case LeSInt64:
      case LeUInt32:
      case LeUInt64: {
        // These are ok as-is.
        // Check if our children are supported.
        auto* left = expandFromI1(visit(curr->left), curr);
        if (left->isBad()) {
          return left;
        }
        auto* right = expandFromI1(visit(curr->right), curr);
        if (right->isBad()) {
          return right;
        }
        // Great, we are supported!
        auto* ret = addNode(Node::makeExpr(curr, curr));
        ret->addValue(left);
        ret->addValue(right);
        return ret;
      }
      case GtSInt32:
      case GtSInt64:
      case GeSInt32:
      case GeSInt64:
      case GtUInt32:
      case GtUInt64:
      case GeUInt32:
      case GeUInt64: {
        // These need to be flipped as Souper does not support redundant ops.
        Builder builder(*module);
        BinaryOp opposite;
        switch (curr->op) {
          case GtSInt32:
            opposite = LtSInt32;
            break;
          case GtSInt64:
            opposite = LtSInt64;
            break;
          case GeSInt32:
            opposite = LeSInt32;
            break;
          case GeSInt64:
            opposite = LeSInt64;
            break;
          case GtUInt32:
            opposite = LtUInt32;
            break;
          case GtUInt64:
            opposite = LtUInt64;
            break;
          case GeUInt32:
            opposite = LeUInt32;
            break;
          case GeUInt64:
            opposite = LeUInt64;
            break;
          default:
            WASM_UNREACHABLE("unexpected op");
        }
        auto* ret =
          visitBinary(builder.makeBinary(opposite, curr->right, curr->left));
        // We just created a new binary node, but we need to set the origin
        // properly to the original.
        ret->origin = curr;
        return ret;
      }
      default: {
        // Anything else is an unknown value.
        return makeVar(curr->type);
      }
    }
  }